

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O1

void __thiscall
optimization::graph_color::Graph_Color::optimize_func
          (Graph_Color *this,string *funcId,MirFunction *func)

{
  _Atomic_word *p_Var1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::graph_color::Conflict_Map>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::graph_color::Conflict_Map>_>_>_>
  *this_01;
  _Base_ptr *pp_Var3;
  _Rb_tree_color _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  _Base_ptr this_03;
  element_type *peVar5;
  element_type *peVar6;
  _func_int **pp_Var7;
  _Alloc_hider _Var8;
  char cVar9;
  ostream *poVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  undefined8 uVar13;
  mapped_type *pmVar14;
  _Rb_tree_node_base *p_Var15;
  Graph_Color *pGVar16;
  size_type sVar17;
  _Base_ptr p_Var18;
  long *plVar19;
  _Atomic_word *p_Var20;
  _Self __tmp;
  char *pcVar21;
  _Rb_tree_const_iterator<mir::inst::VarId> __first;
  Function *tag;
  Tag *pTVar22;
  __hashtable *__h;
  _Rb_tree_header *p_Var23;
  VarId var;
  mapped_type conflict_map;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  cross_blk_vars;
  shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>
  map;
  Livevar_Analyse lva;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_360;
  size_type local_358;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_340;
  size_type local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  undefined **local_320;
  undefined1 *local_318;
  ulong local_310;
  undefined1 uStack_308;
  undefined7 uStack_307;
  undefined1 local_2f8;
  ostream local_2e9;
  Function local_2e8;
  Graph_Color *local_288;
  undefined **local_280;
  undefined4 local_278;
  undefined **local_270;
  undefined8 local_268;
  undefined1 local_260;
  shared_ptr<optimization::graph_color::Conflict_Map> local_258;
  MirFunction *local_248;
  undefined1 local_240 [8];
  _Rb_tree_node_base local_238;
  size_t local_218;
  undefined1 local_210 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>
  local_1e8;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1c0;
  _Alloc_hider _Stack_1b0;
  undefined1 local_1a8 [32];
  bool local_188;
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::_Select1st<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  local_178;
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_148;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_118;
  _Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_int>,_std::_Select1st<std::pair<const_mir::inst::VarId,_int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
  local_78;
  
  if (((func->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      is_extern == false) {
    local_340 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((ulong)local_340 & 0xffffffffffffff00);
    pTVar22 = (Tag *)funcId;
    local_288 = this;
    local_248 = func;
    AixLog::operator<<((ostream *)&local_340,(Severity *)funcId);
    local_2e8.name._M_dataplus._M_p = (pointer)&local_2e8.name.field_2;
    local_2e8._vptr_Function = (_func_int **)&PTR__Tag_001edee0;
    local_2e8.name._M_string_length = 0;
    local_2e8.name.field_2._M_allocated_capacity =
         local_2e8.name.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_2e8.file._M_dataplus._M_p._0_1_ = 1;
    AixLog::operator<<((ostream *)&local_2e8,pTVar22);
    local_358 = std::chrono::_V2::system_clock::now();
    local_360 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__Timestamp_001edeb0;
    local_350._vptr__Sp_counted_base._0_1_ = 0;
    AixLog::operator<<((ostream *)&local_360,(Timestamp *)pTVar22);
    pp_Var3 = &local_238._M_parent;
    local_240 = (undefined1  [8])pp_Var3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"optimize_func","");
    __first._M_node = (_Base_ptr)local_248;
    pcVar21 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
    ;
    local_320 = (undefined **)&local_310;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_320,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
               ,"");
    local_1d8._8_8_ = local_1c8 + 8;
    local_1d8._0_8_ = &PTR__Function_001edf10;
    if (local_240 == (undefined1  [8])pp_Var3) {
      aStack_1c0._8_8_ = local_238._M_left;
    }
    else {
      local_1d8._8_8_ = local_240;
    }
    _Stack_1b0._M_p = local_1a8 + 8;
    local_1c8 = (undefined1  [8])local_238._0_8_;
    local_238._0_8_ = 0;
    local_238._M_parent = (_Base_ptr)((ulong)local_238._M_parent & 0xffffffffffffff00);
    if (local_320 != (undefined **)&local_310) {
      _Stack_1b0._M_p = (pointer)local_320;
    }
    local_1a8._0_8_ = local_318;
    local_318 = (undefined1 *)0x0;
    local_310 = local_310 & 0xffffffffffffff00;
    local_1a8._24_8_ = (_Base_ptr)0x181;
    local_188 = false;
    local_320 = (undefined **)&local_310;
    local_240 = (undefined1  [8])pp_Var3;
    AixLog::operator<<((ostream *)local_1d8,(Function *)pcVar21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"Running graph coloring for",0x1a);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::clog,
                         (((MirFunction *)__first._M_node)->name)._M_dataplus._M_p,
                         (((MirFunction *)__first._M_node)->name)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    AixLog::Function::~Function((Function *)local_1d8);
    if (local_320 != (undefined **)&local_310) {
      operator_delete(local_320,local_310 + 1);
    }
    if (local_240 != (undefined1  [8])pp_Var3) {
      operator_delete((void *)local_240,(ulong)((long)&(local_238._M_parent)->_M_color + 1));
    }
    local_2e8._vptr_Function = (_func_int **)&PTR__Tag_001edee0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8.name._M_dataplus._M_p != &local_2e8.name.field_2) {
      operator_delete(local_2e8.name._M_dataplus._M_p,
                      local_2e8.name.field_2._M_allocated_capacity + 1);
    }
    local_238._M_left = &local_238;
    local_238._0_8_ = local_238._0_8_ & 0xffffffff00000000;
    local_238._M_parent = (_Base_ptr)0x0;
    local_218 = 0;
    p_Var15 = (_Rb_tree_node_base *)(local_1d8 + 8);
    local_1c8 = (undefined1  [8])0x0;
    local_1d8._0_8_ = (_func_int **)0x0;
    local_1d8._8_8_ = (pointer)0x0;
    _Stack_1b0._M_p = (pointer)0x0;
    local_1e8.
    super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_238._M_right = local_238._M_left;
    aStack_1c0._M_allocated_capacity = (size_type)p_Var15;
    aStack_1c0._8_8_ = p_Var15;
    local_1e8.
    super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
    (local_1e8.
     super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
     ._M_refcount._M_pi)->_M_use_count = 1;
    (local_1e8.
     super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
     ._M_refcount._M_pi)->_M_weak_count = 1;
    (local_1e8.
     super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
     ._M_refcount._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_001ee9a0;
    p_Var1 = &local_1e8.
              super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi[1]._M_use_count;
    if (local_1c8 == (undefined1  [8])0x0) {
      local_1e8.
      super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi[1]._M_use_count = 0;
      local_1e8.
      super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      *(_Atomic_word **)
       &local_1e8.
        super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi[2]._M_use_count = p_Var1;
      local_1e8.
      super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi[3]._vptr__Sp_counted_base = (_func_int **)p_Var1;
      p_Var20 = &local_1e8.
                 super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi[3]._M_use_count;
    }
    else {
      p_Var20 = (_Atomic_word *)&_Stack_1b0;
      local_1e8.
      super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi[1]._M_use_count = local_1d8._8_4_;
      local_1e8.
      super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)local_1c8;
      local_1e8.
      super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi[2]._M_use_count = aStack_1c0._M_allocated_capacity._0_4_;
      local_1e8.
      super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi[2]._M_weak_count = aStack_1c0._M_allocated_capacity._4_4_;
      local_1e8.
      super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi[3]._vptr__Sp_counted_base = (_func_int **)aStack_1c0._8_8_;
      *(_Atomic_word **)((long)local_1c8 + 8) = p_Var1;
      *(pointer *)
       &local_1e8.
        super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi[3]._M_use_count = _Stack_1b0._M_p;
      local_1c8 = (undefined1  [8])0x0;
      aStack_1c0._M_allocated_capacity = (size_type)p_Var15;
      aStack_1c0._8_8_ = p_Var15;
    }
    *(pointer *)p_Var20 = (pointer)0x0;
    local_1e8.
    super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              (local_1e8.
               super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi + 1);
    std::
    _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_int>,_std::_Select1st<std::pair<const_mir::inst::VarId,_int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
    ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_int>,_std::_Select1st<std::pair<const_mir::inst::VarId,_int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
                 *)local_1d8);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>
                *)local_1d8,funcId,&local_1e8);
    this_00 = &local_288->func_color_map;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<std::map<mir::inst::VarId,int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<std::map<mir::inst::VarId,int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<std::pair<std::__cxx11::string_const,std::shared_ptr<std::map<mir::inst::VarId,int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<std::map<mir::inst::VarId,int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<std::map<mir::inst::VarId,int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this_00,local_1d8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_1b0._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_1b0._M_p);
    }
    if ((undefined1 *)local_1d8._0_8_ != local_1c8) {
      operator_delete((void *)local_1d8._0_8_,(ulong)((long)local_1c8 + 1));
    }
    pmVar11 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,funcId);
    local_210._16_8_ =
         (pmVar11->
         super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
         )._M_ptr;
    local_1f8._M_allocated_capacity =
         (size_type)
         (pmVar11->
         super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
         )._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_allocated_capacity !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_allocated_capacity)->
        _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_1f8._M_allocated_capacity)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_allocated_capacity)->
        _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_1f8._M_allocated_capacity)->_M_use_count + 1;
      }
    }
    Conflict_Map::Conflict_Map
              ((Conflict_Map *)local_1d8,
               (shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>
                *)(local_210 + 0x10),(MirFunction *)__first._M_node,local_288->color_num);
    local_2e8._vptr_Function = (_func_int **)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<optimization::graph_color::Conflict_Map,std::allocator<optimization::graph_color::Conflict_Map>,optimization::graph_color::Conflict_Map>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2e8.name,
               (Conflict_Map **)&local_2e8,
               (allocator<optimization::graph_color::Conflict_Map> *)&local_320,
               (Conflict_Map *)local_1d8);
    this_01 = &local_288->func_conflict_map;
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::graph_color::Conflict_Map>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::graph_color::Conflict_Map>_>_>_>
              ::operator[](this_01,funcId);
    _Var8._M_p = local_2e8.name._M_dataplus._M_p;
    pp_Var7 = local_2e8._vptr_Function;
    local_2e8._vptr_Function = (_func_int **)0x0;
    local_2e8.name._M_dataplus._M_p = (pointer)0x0;
    this_02 = (pmVar12->
              super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount._M_pi;
    (pmVar12->
    super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
         = (element_type *)pp_Var7;
    (pmVar12->
    super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var8._M_p;
    if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8.name._M_dataplus._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8.name._M_dataplus._M_p);
    }
    std::
    _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_int>,_std::_Select1st<std::pair<const_mir::inst::VarId,_int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
    ::~_Rb_tree(&local_78);
    if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
    }
    if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
    }
    std::_Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Deque_base(&local_e8);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
    ::~_Rb_tree(&local_118);
    std::
    _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
    ::~_Rb_tree(&local_148);
    std::
    _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::_Select1st<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
    ::~_Rb_tree(&local_178);
    std::
    _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                 *)local_1a8);
    std::
    _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                 *)local_1d8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_allocated_capacity !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_allocated_capacity);
    }
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::graph_color::Conflict_Map>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::graph_color::Conflict_Map>_>_>_>
              ::operator[](this_01,funcId);
    local_258.
    super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pmVar12->
         super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
    local_258.
    super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (pmVar12->
         super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if (local_258.
        super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_258.
         super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_258.
              super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_258.
         super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_258.
              super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                *)local_1d8,funcId,
               &(local_258.
                 super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->unused_colors);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<std::set<int,std::less<int>,std::allocator<int>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<std::set<int,std::less<int>,std::allocator<int>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<std::pair<std::__cxx11::string_const,std::shared_ptr<std::set<int,std::less<int>,std::allocator<int>>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<std::set<int,std::less<int>,std::allocator<int>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<std::set<int,std::less<int>,std::allocator<int>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_288->func_unused_colors,local_1d8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_1b0._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_1b0._M_p);
    }
    if ((undefined1 *)local_1d8._0_8_ != local_1c8) {
      operator_delete((void *)local_1d8._0_8_,(ulong)((long)local_1c8 + 1));
    }
    livevar_analyse::Livevar_Analyse::Livevar_Analyse
              ((Livevar_Analyse *)local_1d8,(MirFunction *)__first._M_node,true);
    livevar_analyse::Livevar_Analyse::build((Livevar_Analyse *)local_1d8);
    if ((_Rb_tree_node_base *)aStack_1c0._M_allocated_capacity != p_Var15) {
      uVar13 = aStack_1c0._M_allocated_capacity;
      do {
        p_Var18 = ((_Rb_tree_node_base *)(uVar13 + 0x20))->_M_parent;
        this_03 = ((_Rb_tree_node_base *)(uVar13 + 0x20))->_M_left;
        if (this_03 != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&this_03->_M_parent = *(int *)&this_03->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&this_03->_M_parent = *(int *)&this_03->_M_parent + 1;
          }
        }
        p_Var18 = p_Var18->_M_right;
        __first._M_node = p_Var18->_M_right;
        std::
        _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<mir::inst::VarId>>
                  ((_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                    *)local_240,__first,
                   (_Rb_tree_const_iterator<mir::inst::VarId>)&p_Var18->_M_parent);
        if (this_03 != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03);
        }
        uVar13 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar13);
      } while ((_Rb_tree_node_base *)uVar13 != p_Var15);
    }
    local_280 = (undefined **)((ulong)local_280 & 0xffffffffffffff00);
    AixLog::operator<<((ostream *)&local_280,(Severity *)__first._M_node);
    local_318 = &uStack_308;
    local_320 = &PTR__Tag_001edee0;
    local_310 = 0;
    uStack_308 = 0;
    local_2f8 = 1;
    AixLog::operator<<((ostream *)&local_320,(Tag *)__first._M_node);
    local_268 = std::chrono::_V2::system_clock::now();
    local_270 = &PTR__Timestamp_001edeb0;
    local_260 = 0;
    AixLog::operator<<((ostream *)&local_270,(Timestamp *)__first._M_node);
    local_360 = &local_350;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"optimize_func","");
    pcVar21 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
    ;
    local_340 = &local_330;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_340,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
               ,"");
    local_2e8._vptr_Function = (_func_int **)&PTR__Function_001edf10;
    local_2e8.name._M_dataplus._M_p = (pointer)&local_2e8.name.field_2;
    if (local_360 == &local_350) {
      local_2e8.name.field_2._8_4_ = local_350._M_use_count;
      local_2e8.name.field_2._12_4_ = local_350._M_weak_count;
    }
    else {
      local_2e8.name._M_dataplus._M_p = (pointer)local_360;
    }
    local_2e8.name.field_2._M_allocated_capacity._1_7_ = local_350._vptr__Sp_counted_base._1_7_;
    local_2e8.name.field_2._M_local_buf[0] = local_350._vptr__Sp_counted_base._0_1_;
    local_2e8.file._M_dataplus._M_p = (pointer)&local_2e8.file.field_2;
    local_2e8.name._M_string_length = local_358;
    local_358 = 0;
    local_350._vptr__Sp_counted_base._0_1_ = 0;
    if (local_340 == &local_330) {
      local_2e8.file.field_2._8_8_ = local_330._8_8_;
    }
    else {
      local_2e8.file._M_dataplus._M_p = (pointer)local_340;
    }
    local_2e8.file.field_2._M_allocated_capacity._1_7_ = local_330._M_allocated_capacity._1_7_;
    local_2e8.file.field_2._M_local_buf[0] = local_330._M_local_buf[0];
    local_2e8.file._M_string_length = local_338;
    local_338 = 0;
    local_330._M_local_buf[0] = '\0';
    local_2e8.line = 0x18e;
    local_2e8.is_null_ = false;
    local_360 = &local_350;
    local_340 = &local_330;
    AixLog::operator<<((ostream *)&local_2e8,(Function *)pcVar21);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog," Conflict map :",0xf);
    cVar9 = std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
    tag = (Function *)(ulong)(uint)(int)cVar9;
    std::ostream::put(-0x80);
    std::ostream::flush();
    AixLog::Function::~Function(&local_2e8);
    if (local_340 != &local_330) {
      tag = (Function *)
            (CONCAT71(local_330._M_allocated_capacity._1_7_,local_330._M_local_buf[0]) + 1);
      operator_delete(local_340,(ulong)tag);
    }
    if (local_360 != &local_350) {
      tag = (Function *)
            (CONCAT71(local_350._vptr__Sp_counted_base._1_7_,local_350._vptr__Sp_counted_base._0_1_)
            + 1);
      operator_delete(local_360,(ulong)tag);
    }
    local_320 = &PTR__Tag_001edee0;
    if (local_318 != &uStack_308) {
      tag = (Function *)(CONCAT71(uStack_307,uStack_308) + 1);
      operator_delete(local_318,(ulong)tag);
    }
    if (local_288->enable == true) {
      p_Var15 = (local_248->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var23 = &(local_248->basic_blks)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var15 != p_Var23) {
        do {
          pmVar14 = std::
                    map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
                    ::operator[]((map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
                                  *)local_1d8,(key_type *)(p_Var15 + 1));
          local_210._0_8_ =
               (pmVar14->
               super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
          local_210._8_8_ =
               (pmVar14->
               super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_)->_M_use_count +
                   1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_)->_M_use_count +
                   1;
            }
          }
          tag = (Function *)local_210;
          init_conflict_map(local_288,
                            (shared_ptr<optimization::livevar_analyse::Block_Live_Var> *)tag,
                            &local_258,
                            (set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                             *)local_240);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_);
          }
          p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
        } while ((_Rb_tree_header *)p_Var15 != p_Var23);
      }
      Conflict_Map::init_edge_vars
                (local_258.
                 super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      pGVar16 = (Graph_Color *)
                ((local_258.
                  super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->dynamic_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_1f8._8_8_ =
           &((local_258.
              super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->dynamic_Map)._M_t._M_impl.super__Rb_tree_header;
      if (pGVar16 != (Graph_Color *)local_1f8._8_8_) {
        do {
          local_280 = (undefined **)((ulong)local_280 & 0xffffffffffffff00);
          AixLog::operator<<((ostream *)&local_280,(Severity *)tag);
          local_320 = &PTR__Tag_001edee0;
          local_318 = &uStack_308;
          local_310 = 0;
          uStack_308 = 0;
          local_2f8 = 1;
          AixLog::operator<<((ostream *)&local_320,(Tag *)tag);
          local_268 = std::chrono::_V2::system_clock::now();
          local_270 = &PTR__Timestamp_001edeb0;
          local_260 = 0;
          AixLog::operator<<((ostream *)&local_270,(Timestamp *)tag);
          local_360 = &local_350;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"optimize_func","");
          pcVar21 = 
          "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
          ;
          local_340 = &local_330;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_340,
                     "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                     ,"");
          local_2e8._vptr_Function = (_func_int **)&PTR__Function_001edf10;
          local_2e8.name._M_dataplus._M_p = (pointer)&local_2e8.name.field_2;
          if (local_360 == &local_350) {
            local_2e8.name.field_2._8_4_ = local_350._M_use_count;
            local_2e8.name.field_2._12_4_ = local_350._M_weak_count;
          }
          else {
            local_2e8.name._M_dataplus._M_p = (pointer)local_360;
          }
          local_2e8.name.field_2._M_allocated_capacity._1_7_ =
               local_350._vptr__Sp_counted_base._1_7_;
          local_2e8.name.field_2._M_local_buf[0] = local_350._vptr__Sp_counted_base._0_1_;
          local_2e8.name._M_string_length = local_358;
          local_358 = 0;
          local_350._vptr__Sp_counted_base._0_1_ = 0;
          local_2e8.file._M_dataplus._M_p = (pointer)&local_2e8.file.field_2;
          if (local_340 == &local_330) {
            local_2e8.file.field_2._8_8_ = local_330._8_8_;
          }
          else {
            local_2e8.file._M_dataplus._M_p = (pointer)local_340;
          }
          local_2e8.file.field_2._M_allocated_capacity._1_7_ = local_330._M_allocated_capacity._1_7_
          ;
          local_2e8.file.field_2._M_local_buf[0] = local_330._M_local_buf[0];
          local_2e8.file._M_string_length = local_338;
          local_338 = 0;
          local_330._M_local_buf[0] = '\0';
          local_2e8.line = 0x198;
          local_2e8.is_null_ = false;
          local_360 = &local_350;
          local_340 = &local_330;
          AixLog::operator<<((ostream *)&local_2e8,(Function *)pcVar21);
          paVar2 = &(pGVar16->name).field_2;
          (*(code *)**(undefined8 **)paVar2)(paVar2,&std::clog);
          pcVar21 = " conflicts with : ";
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::clog," conflicts with : ",0x12);
          AixLog::Function::~Function(&local_2e8);
          if (local_340 != &local_330) {
            pcVar21 = (char *)(CONCAT71(local_330._M_allocated_capacity._1_7_,
                                        local_330._M_local_buf[0]) + 1);
            operator_delete(local_340,(ulong)pcVar21);
          }
          if (local_360 != &local_350) {
            pcVar21 = (char *)(CONCAT71(local_350._vptr__Sp_counted_base._1_7_,
                                        local_350._vptr__Sp_counted_base._0_1_) + 1);
            operator_delete(local_360,(ulong)pcVar21);
          }
          local_320 = &PTR__Tag_001edee0;
          if (local_318 != &uStack_308) {
            pcVar21 = (char *)(CONCAT71(uStack_307,uStack_308) + 1);
            operator_delete(local_318,(ulong)pcVar21);
          }
          local_288 = pGVar16;
          for (p_Var15 = (pGVar16->blk_livevar_analyse)._M_t._M_impl.super__Rb_tree_header._M_header
                         ._M_parent; p_Var15 != (_Rb_tree_node_base *)&pGVar16->blk_livevar_analyse;
              p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
            local_280 = &PTR_display_001ee058;
            local_278 = *(undefined4 *)&p_Var15[1]._M_parent;
            local_2e9 = (ostream)0x0;
            AixLog::operator<<(&local_2e9,(Severity *)pcVar21);
            local_320 = &PTR__Tag_001edee0;
            local_318 = &uStack_308;
            local_310 = 0;
            uStack_308 = 0;
            local_2f8 = 1;
            AixLog::operator<<((ostream *)&local_320,(Tag *)pcVar21);
            local_268 = std::chrono::_V2::system_clock::now();
            local_270 = &PTR__Timestamp_001edeb0;
            local_260 = 0;
            AixLog::operator<<((ostream *)&local_270,(Timestamp *)pcVar21);
            local_360 = &local_350;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"optimize_func","")
            ;
            pcVar21 = 
            "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
            ;
            local_340 = &local_330;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_340,
                       "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                       ,"");
            local_2e8._vptr_Function = (_func_int **)&PTR__Function_001edf10;
            local_2e8.name._M_dataplus._M_p = (pointer)&local_2e8.name.field_2;
            if (local_360 == &local_350) {
              local_2e8.name.field_2._8_4_ = local_350._M_use_count;
              local_2e8.name.field_2._12_4_ = local_350._M_weak_count;
            }
            else {
              local_2e8.name._M_dataplus._M_p = (pointer)local_360;
            }
            local_2e8.name.field_2._M_allocated_capacity._1_7_ =
                 local_350._vptr__Sp_counted_base._1_7_;
            local_2e8.name.field_2._M_local_buf[0] = local_350._vptr__Sp_counted_base._0_1_;
            local_2e8.name._M_string_length = local_358;
            local_358 = 0;
            local_350._vptr__Sp_counted_base._0_1_ = 0;
            local_2e8.file._M_dataplus._M_p = (pointer)&local_2e8.file.field_2;
            if (local_340 == &local_330) {
              local_2e8.file.field_2._8_8_ = local_330._8_8_;
            }
            else {
              local_2e8.file._M_dataplus._M_p = (pointer)local_340;
            }
            local_2e8.file.field_2._M_allocated_capacity._1_7_ =
                 local_330._M_allocated_capacity._1_7_;
            local_2e8.file.field_2._M_local_buf[0] = local_330._M_local_buf[0];
            local_2e8.file._M_string_length = local_338;
            local_338 = 0;
            local_330._M_local_buf[0] = '\0';
            local_2e8.line = 0x19a;
            local_2e8.is_null_ = false;
            local_360 = &local_350;
            local_340 = &local_330;
            AixLog::operator<<((ostream *)&local_2e8,(Function *)pcVar21);
            (*(code *)*local_280)(&local_280,&std::clog);
            pcVar21 = ", ";
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,", ",2);
            AixLog::Function::~Function(&local_2e8);
            if (local_340 != &local_330) {
              pcVar21 = (char *)(CONCAT71(local_330._M_allocated_capacity._1_7_,
                                          local_330._M_local_buf[0]) + 1);
              operator_delete(local_340,(ulong)pcVar21);
            }
            if (local_360 != &local_350) {
              pcVar21 = (char *)(CONCAT71(local_350._vptr__Sp_counted_base._1_7_,
                                          local_350._vptr__Sp_counted_base._0_1_) + 1);
              operator_delete(local_360,(ulong)pcVar21);
            }
            local_320 = &PTR__Tag_001edee0;
            if (local_318 != &uStack_308) {
              pcVar21 = (char *)(CONCAT71(uStack_307,uStack_308) + 1);
              operator_delete(local_318,(ulong)pcVar21);
            }
          }
          local_280 = (undefined **)((ulong)local_280 & 0xffffffffffffff00);
          AixLog::operator<<((ostream *)&local_280,(Severity *)pcVar21);
          local_320 = &PTR__Tag_001edee0;
          local_318 = &uStack_308;
          local_310 = 0;
          uStack_308 = 0;
          local_2f8 = 1;
          AixLog::operator<<((ostream *)&local_320,(Tag *)pcVar21);
          pGVar16 = local_288;
          local_268 = std::chrono::_V2::system_clock::now();
          local_270 = &PTR__Timestamp_001edeb0;
          local_260 = 0;
          AixLog::operator<<((ostream *)&local_270,(Timestamp *)pcVar21);
          local_360 = &local_350;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"optimize_func","");
          pcVar21 = 
          "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
          ;
          local_340 = &local_330;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_340,
                     "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                     ,"");
          local_2e8._vptr_Function = (_func_int **)&PTR__Function_001edf10;
          local_2e8.name._M_dataplus._M_p = (pointer)&local_2e8.name.field_2;
          if (local_360 == &local_350) {
            local_2e8.name.field_2._8_4_ = local_350._M_use_count;
            local_2e8.name.field_2._12_4_ = local_350._M_weak_count;
          }
          else {
            local_2e8.name._M_dataplus._M_p = (pointer)local_360;
          }
          local_2e8.name.field_2._M_allocated_capacity._1_7_ =
               local_350._vptr__Sp_counted_base._1_7_;
          local_2e8.name.field_2._M_local_buf[0] = local_350._vptr__Sp_counted_base._0_1_;
          local_2e8.name._M_string_length = local_358;
          local_358 = 0;
          local_350._vptr__Sp_counted_base._0_1_ = 0;
          local_2e8.file._M_dataplus._M_p = (pointer)&local_2e8.file.field_2;
          if (local_340 == &local_330) {
            local_2e8.file.field_2._8_8_ = local_330._8_8_;
          }
          else {
            local_2e8.file._M_dataplus._M_p = (pointer)local_340;
          }
          local_2e8.file.field_2._M_allocated_capacity._1_7_ = local_330._M_allocated_capacity._1_7_
          ;
          local_2e8.file.field_2._M_local_buf[0] = local_330._M_local_buf[0];
          local_2e8.file._M_string_length = local_338;
          local_338 = 0;
          local_330._M_local_buf[0] = '\0';
          local_2e8.line = 0x19c;
          local_2e8.is_null_ = false;
          local_360 = &local_350;
          local_340 = &local_330;
          AixLog::operator<<((ostream *)&local_2e8,(Function *)pcVar21);
          cVar9 = std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
          tag = (Function *)(ulong)(uint)(int)cVar9;
          std::ostream::put(-0x80);
          std::ostream::flush();
          AixLog::Function::~Function(&local_2e8);
          if (local_340 != &local_330) {
            tag = (Function *)
                  (CONCAT71(local_330._M_allocated_capacity._1_7_,local_330._M_local_buf[0]) + 1);
            operator_delete(local_340,(ulong)tag);
          }
          if (local_360 != &local_350) {
            tag = (Function *)
                  (CONCAT71(local_350._vptr__Sp_counted_base._1_7_,
                            local_350._vptr__Sp_counted_base._0_1_) + 1);
            operator_delete(local_360,(ulong)tag);
          }
          local_320 = &PTR__Tag_001edee0;
          if (local_318 != &uStack_308) {
            tag = (Function *)(CONCAT71(uStack_307,uStack_308) + 1);
            operator_delete(local_318,(ulong)tag);
          }
          pGVar16 = (Graph_Color *)std::_Rb_tree_increment((_Rb_tree_node_base *)pGVar16);
        } while (pGVar16 != (Graph_Color *)local_1f8._8_8_);
      }
      while (((local_258.
               super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->dynamic_Map)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        Conflict_Map::remove_edge_less_colors
                  (local_258.
                   super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        Conflict_Map::remove_edge_larger_colors
                  (local_258.
                   super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
      }
      Conflict_Map::rebuild
                (local_258.
                 super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
    }
    if (local_238._M_left != &local_238) {
      p_Var18 = local_238._M_left;
      do {
        tag = (Function *)(p_Var18 + 1);
        sVar17 = std::
                 map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
                 ::count(((local_258.
                           super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->color_map).
                         super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,(key_type *)tag);
        if (sVar17 == 0) {
          local_2e8._vptr_Function = (_func_int **)&PTR_display_001ee058;
          local_2e8.name._M_dataplus._M_p._0_4_ = *(undefined4 *)&p_Var18[1]._M_parent;
          local_2e8.name._M_string_length =
               CONCAT44(local_2e8.name._M_string_length._4_4_,0xffffffff);
          tag = &local_2e8;
          std::
          _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,int>,std::_Select1st<std::pair<mir::inst::VarId_const,int>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>
          ::_M_emplace_unique<std::pair<mir::inst::VarId,int>>
                    ((_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,int>,std::_Select1st<std::pair<mir::inst::VarId_const,int>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>
                      *)((local_258.
                          super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->color_map).
                        super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,(pair<mir::inst::VarId,_int> *)&local_2e8);
        }
        p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
      } while (p_Var18 != &local_238);
    }
    local_280 = (undefined **)((ulong)local_280 & 0xffffffffffffff00);
    AixLog::operator<<((ostream *)&local_280,(Severity *)tag);
    local_320 = &PTR__Tag_001edee0;
    local_318 = &uStack_308;
    local_310 = 0;
    uStack_308 = 0;
    local_2f8 = 1;
    AixLog::operator<<((ostream *)&local_320,(Tag *)tag);
    local_268 = std::chrono::_V2::system_clock::now();
    local_270 = &PTR__Timestamp_001edeb0;
    local_260 = 0;
    AixLog::operator<<((ostream *)&local_270,(Timestamp *)tag);
    local_360 = &local_350;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"optimize_func","");
    pcVar21 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
    ;
    local_340 = &local_330;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_340,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
               ,"");
    local_2e8._vptr_Function = (_func_int **)&PTR__Function_001edf10;
    local_2e8.name._M_dataplus._M_p = (pointer)&local_2e8.name.field_2;
    if (local_360 == &local_350) {
      local_2e8.name.field_2._8_4_ = local_350._M_use_count;
      local_2e8.name.field_2._12_4_ = local_350._M_weak_count;
    }
    else {
      local_2e8.name._M_dataplus._M_p = (pointer)local_360;
    }
    local_2e8.name.field_2._M_allocated_capacity._1_7_ = local_350._vptr__Sp_counted_base._1_7_;
    local_2e8.name.field_2._M_local_buf[0] = local_350._vptr__Sp_counted_base._0_1_;
    local_2e8.name._M_string_length = local_358;
    local_358 = 0;
    local_350._vptr__Sp_counted_base._0_1_ = 0;
    local_2e8.file._M_dataplus._M_p = (pointer)&local_2e8.file.field_2;
    if (local_340 == &local_330) {
      local_2e8.file.field_2._8_8_ = local_330._8_8_;
    }
    else {
      local_2e8.file._M_dataplus._M_p = (pointer)local_340;
    }
    local_2e8.file.field_2._M_allocated_capacity._1_7_ = local_330._M_allocated_capacity._1_7_;
    local_2e8.file.field_2._M_local_buf[0] = local_330._M_local_buf[0];
    local_2e8.file._M_string_length = local_338;
    local_338 = 0;
    local_330._M_local_buf[0] = '\0';
    local_2e8.line = 0x1aa;
    local_2e8.is_null_ = false;
    local_360 = &local_350;
    local_340 = &local_330;
    AixLog::operator<<((ostream *)&local_2e8,(Function *)pcVar21);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::clog,(local_248->name)._M_dataplus._M_p,
                         (local_248->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," coloring result : ",0x13);
    cVar9 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    pTVar22 = (Tag *)(ulong)(uint)(int)cVar9;
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    AixLog::Function::~Function(&local_2e8);
    if (local_340 != &local_330) {
      pTVar22 = (Tag *)(CONCAT71(local_330._M_allocated_capacity._1_7_,local_330._M_local_buf[0]) +
                       1);
      operator_delete(local_340,(ulong)pTVar22);
    }
    if (local_360 != &local_350) {
      pTVar22 = (Tag *)(CONCAT71(local_350._vptr__Sp_counted_base._1_7_,
                                 local_350._vptr__Sp_counted_base._0_1_) + 1);
      operator_delete(local_360,(ulong)pTVar22);
    }
    local_320 = &PTR__Tag_001edee0;
    if (local_318 != &uStack_308) {
      pTVar22 = (Tag *)(CONCAT71(uStack_307,uStack_308) + 1);
      operator_delete(local_318,(ulong)pTVar22);
    }
    local_280 = (undefined **)((ulong)local_280 & 0xffffffffffffff00);
    AixLog::operator<<((ostream *)&local_280,(Severity *)pTVar22);
    local_320 = &PTR__Tag_001edee0;
    local_318 = &uStack_308;
    local_310 = 0;
    uStack_308 = 0;
    local_2f8 = 1;
    AixLog::operator<<((ostream *)&local_320,pTVar22);
    local_268 = std::chrono::_V2::system_clock::now();
    local_270 = &PTR__Timestamp_001edeb0;
    local_260 = 0;
    AixLog::operator<<((ostream *)&local_270,(Timestamp *)pTVar22);
    local_360 = &local_350;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"optimize_func","");
    pcVar21 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
    ;
    local_340 = &local_330;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_340,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
               ,"");
    local_2e8._vptr_Function = (_func_int **)&PTR__Function_001edf10;
    local_2e8.name._M_dataplus._M_p = (pointer)&local_2e8.name.field_2;
    if (local_360 == &local_350) {
      local_2e8.name.field_2._8_4_ = local_350._M_use_count;
      local_2e8.name.field_2._12_4_ = local_350._M_weak_count;
    }
    else {
      local_2e8.name._M_dataplus._M_p = (pointer)local_360;
    }
    local_2e8.name.field_2._M_allocated_capacity._1_7_ = local_350._vptr__Sp_counted_base._1_7_;
    local_2e8.name.field_2._M_local_buf[0] = local_350._vptr__Sp_counted_base._0_1_;
    local_2e8.name._M_string_length = local_358;
    local_358 = 0;
    local_350._vptr__Sp_counted_base._0_1_ = 0;
    local_2e8.file._M_dataplus._M_p = (pointer)&local_2e8.file.field_2;
    if (local_340 == &local_330) {
      local_2e8.file.field_2._8_8_ = local_330._8_8_;
    }
    else {
      local_2e8.file._M_dataplus._M_p = (pointer)local_340;
    }
    local_2e8.file.field_2._M_allocated_capacity._1_7_ = local_330._M_allocated_capacity._1_7_;
    local_2e8.file.field_2._M_local_buf[0] = local_330._M_local_buf[0];
    local_2e8.file._M_string_length = local_338;
    local_338 = 0;
    local_330._M_local_buf[0] = '\0';
    local_2e8.line = 0x1ab;
    local_2e8.is_null_ = false;
    local_360 = &local_350;
    local_340 = &local_330;
    AixLog::operator<<((ostream *)&local_2e8,(Function *)pcVar21);
    pcVar21 = "unused colors : ";
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"unused colors : ",0x10);
    AixLog::Function::~Function(&local_2e8);
    if (local_340 != &local_330) {
      pcVar21 = (char *)(CONCAT71(local_330._M_allocated_capacity._1_7_,local_330._M_local_buf[0]) +
                        1);
      operator_delete(local_340,(ulong)pcVar21);
    }
    if (local_360 != &local_350) {
      pcVar21 = (char *)(CONCAT71(local_350._vptr__Sp_counted_base._1_7_,
                                  local_350._vptr__Sp_counted_base._0_1_) + 1);
      operator_delete(local_360,(ulong)pcVar21);
    }
    local_320 = &PTR__Tag_001edee0;
    if (local_318 != &uStack_308) {
      pcVar21 = (char *)(CONCAT71(uStack_307,uStack_308) + 1);
      operator_delete(local_318,(ulong)pcVar21);
    }
    peVar5 = ((local_258.
               super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->unused_colors).
             super___shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    p_Var18 = (peVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var23 = &(peVar5->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var18 != p_Var23) {
      do {
        _Var4 = p_Var18[1]._M_color;
        local_280 = (undefined **)((ulong)local_280 & 0xffffffffffffff00);
        AixLog::operator<<((ostream *)&local_280,(Severity *)pcVar21);
        local_320 = &PTR__Tag_001edee0;
        local_318 = &uStack_308;
        local_310 = 0;
        uStack_308 = 0;
        local_2f8 = 1;
        AixLog::operator<<((ostream *)&local_320,(Tag *)pcVar21);
        local_268 = std::chrono::_V2::system_clock::now();
        local_270 = &PTR__Timestamp_001edeb0;
        local_260 = 0;
        AixLog::operator<<((ostream *)&local_270,(Timestamp *)pcVar21);
        local_360 = &local_350;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"optimize_func","");
        pcVar21 = 
        "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
        ;
        local_340 = &local_330;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_340,
                   "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                   ,"");
        local_2e8._vptr_Function = (_func_int **)&PTR__Function_001edf10;
        local_2e8.name._M_dataplus._M_p = (pointer)&local_2e8.name.field_2;
        if (local_360 == &local_350) {
          local_2e8.name.field_2._8_4_ = local_350._M_use_count;
          local_2e8.name.field_2._12_4_ = local_350._M_weak_count;
        }
        else {
          local_2e8.name._M_dataplus._M_p = (pointer)local_360;
        }
        local_2e8.name.field_2._M_allocated_capacity._1_7_ = local_350._vptr__Sp_counted_base._1_7_;
        local_2e8.name.field_2._M_local_buf[0] = local_350._vptr__Sp_counted_base._0_1_;
        local_2e8.name._M_string_length = local_358;
        local_358 = 0;
        local_350._vptr__Sp_counted_base._0_1_ = 0;
        local_2e8.file._M_dataplus._M_p = (pointer)&local_2e8.file.field_2;
        if (local_340 == &local_330) {
          local_2e8.file.field_2._8_8_ = local_330._8_8_;
        }
        else {
          local_2e8.file._M_dataplus._M_p = (pointer)local_340;
        }
        local_2e8.file.field_2._M_allocated_capacity._1_7_ = local_330._M_allocated_capacity._1_7_;
        local_2e8.file.field_2._M_local_buf[0] = local_330._M_local_buf[0];
        local_2e8.file._M_string_length = local_338;
        local_338 = 0;
        local_330._M_local_buf[0] = '\0';
        local_2e8.line = 0x1ad;
        local_2e8.is_null_ = false;
        local_360 = &local_350;
        local_340 = &local_330;
        AixLog::operator<<((ostream *)&local_2e8,(Function *)pcVar21);
        poVar10 = (ostream *)std::ostream::operator<<(&std::clog,_Var4);
        pcVar21 = " ";
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        AixLog::Function::~Function(&local_2e8);
        if (local_340 != &local_330) {
          pcVar21 = (char *)(CONCAT71(local_330._M_allocated_capacity._1_7_,
                                      local_330._M_local_buf[0]) + 1);
          operator_delete(local_340,(ulong)pcVar21);
        }
        if (local_360 != &local_350) {
          pcVar21 = (char *)(CONCAT71(local_350._vptr__Sp_counted_base._1_7_,
                                      local_350._vptr__Sp_counted_base._0_1_) + 1);
          operator_delete(local_360,(ulong)pcVar21);
        }
        local_320 = &PTR__Tag_001edee0;
        if (local_318 != &uStack_308) {
          pcVar21 = (char *)(CONCAT71(uStack_307,uStack_308) + 1);
          operator_delete(local_318,(ulong)pcVar21);
        }
        p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
      } while ((_Rb_tree_header *)p_Var18 != p_Var23);
    }
    local_280 = (undefined **)((ulong)local_280 & 0xffffffffffffff00);
    AixLog::operator<<((ostream *)&local_280,(Severity *)pcVar21);
    local_320 = &PTR__Tag_001edee0;
    local_318 = &uStack_308;
    local_310 = 0;
    uStack_308 = 0;
    local_2f8 = 1;
    AixLog::operator<<((ostream *)&local_320,(Tag *)pcVar21);
    local_268 = std::chrono::_V2::system_clock::now();
    local_270 = &PTR__Timestamp_001edeb0;
    local_260 = 0;
    AixLog::operator<<((ostream *)&local_270,(Timestamp *)pcVar21);
    local_360 = &local_350;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"optimize_func","");
    pcVar21 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
    ;
    local_340 = &local_330;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_340,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
               ,"");
    local_2e8._vptr_Function = (_func_int **)&PTR__Function_001edf10;
    local_2e8.name._M_dataplus._M_p = (pointer)&local_2e8.name.field_2;
    if (local_360 == &local_350) {
      local_2e8.name.field_2._8_4_ = local_350._M_use_count;
      local_2e8.name.field_2._12_4_ = local_350._M_weak_count;
    }
    else {
      local_2e8.name._M_dataplus._M_p = (pointer)local_360;
    }
    local_2e8.name.field_2._M_allocated_capacity._1_7_ = local_350._vptr__Sp_counted_base._1_7_;
    local_2e8.name.field_2._M_local_buf[0] = local_350._vptr__Sp_counted_base._0_1_;
    local_2e8.name._M_string_length = local_358;
    local_358 = 0;
    local_350._vptr__Sp_counted_base._0_1_ = 0;
    local_2e8.file._M_dataplus._M_p = (pointer)&local_2e8.file.field_2;
    if (local_340 == &local_330) {
      local_2e8.file.field_2._8_8_ = local_330._8_8_;
    }
    else {
      local_2e8.file._M_dataplus._M_p = (pointer)local_340;
    }
    local_2e8.file.field_2._M_allocated_capacity._1_7_ = local_330._M_allocated_capacity._1_7_;
    local_2e8.file.field_2._M_local_buf[0] = local_330._M_local_buf[0];
    local_2e8.file._M_string_length = local_338;
    local_338 = 0;
    local_330._M_local_buf[0] = '\0';
    local_2e8.line = 0x1af;
    local_2e8.is_null_ = false;
    local_360 = &local_350;
    local_340 = &local_330;
    AixLog::operator<<((ostream *)&local_2e8,(Function *)pcVar21);
    cVar9 = std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
    pTVar22 = (Tag *)(ulong)(uint)(int)cVar9;
    std::ostream::put(-0x80);
    std::ostream::flush();
    AixLog::Function::~Function(&local_2e8);
    if (local_340 != &local_330) {
      pTVar22 = (Tag *)(CONCAT71(local_330._M_allocated_capacity._1_7_,local_330._M_local_buf[0]) +
                       1);
      operator_delete(local_340,(ulong)pTVar22);
    }
    if (local_360 != &local_350) {
      pTVar22 = (Tag *)(CONCAT71(local_350._vptr__Sp_counted_base._1_7_,
                                 local_350._vptr__Sp_counted_base._0_1_) + 1);
      operator_delete(local_360,(ulong)pTVar22);
    }
    local_320 = &PTR__Tag_001edee0;
    if (local_318 != &uStack_308) {
      pTVar22 = (Tag *)(CONCAT71(uStack_307,uStack_308) + 1);
      operator_delete(local_318,(ulong)pTVar22);
    }
    peVar6 = ((local_258.
               super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->color_map).
             super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    p_Var18 = (peVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var18 != &(peVar6->_M_t)._M_impl.super__Rb_tree_header) {
      do {
        local_280 = (undefined **)((ulong)local_280 & 0xffffffffffffff00);
        AixLog::operator<<((ostream *)&local_280,(Severity *)pTVar22);
        local_320 = &PTR__Tag_001edee0;
        local_318 = &uStack_308;
        local_310 = 0;
        uStack_308 = 0;
        local_2f8 = 1;
        AixLog::operator<<((ostream *)&local_320,pTVar22);
        local_268 = std::chrono::_V2::system_clock::now();
        local_270 = &PTR__Timestamp_001edeb0;
        local_260 = 0;
        AixLog::operator<<((ostream *)&local_270,(Timestamp *)pTVar22);
        local_360 = &local_350;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"optimize_func","");
        pcVar21 = 
        "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
        ;
        local_340 = &local_330;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_340,
                   "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                   ,"");
        local_2e8._vptr_Function = (_func_int **)&PTR__Function_001edf10;
        local_2e8.name._M_dataplus._M_p = (pointer)&local_2e8.name.field_2;
        if (local_360 == &local_350) {
          local_2e8.name.field_2._8_4_ = local_350._M_use_count;
          local_2e8.name.field_2._12_4_ = local_350._M_weak_count;
        }
        else {
          local_2e8.name._M_dataplus._M_p = (pointer)local_360;
        }
        local_2e8.name.field_2._M_allocated_capacity._1_7_ = local_350._vptr__Sp_counted_base._1_7_;
        local_2e8.name.field_2._M_local_buf[0] = local_350._vptr__Sp_counted_base._0_1_;
        local_2e8.name._M_string_length = local_358;
        local_358 = 0;
        local_350._vptr__Sp_counted_base._0_1_ = 0;
        local_2e8.file._M_dataplus._M_p = (pointer)&local_2e8.file.field_2;
        if (local_340 == &local_330) {
          local_2e8.file.field_2._8_8_ = local_330._8_8_;
        }
        else {
          local_2e8.file._M_dataplus._M_p = (pointer)local_340;
        }
        local_2e8.file.field_2._M_allocated_capacity._1_7_ = local_330._M_allocated_capacity._1_7_;
        local_2e8.file.field_2._M_local_buf[0] = local_330._M_local_buf[0];
        local_2e8.file._M_string_length = local_338;
        local_338 = 0;
        local_330._M_local_buf[0] = '\0';
        local_2e8.line = 0x1b2;
        local_2e8.is_null_ = false;
        local_360 = &local_350;
        local_340 = &local_330;
        AixLog::operator<<((ostream *)&local_2e8,(Function *)pcVar21);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"variable ",9);
        (*(code *)**(undefined8 **)(p_Var18 + 1))(p_Var18 + 1,&std::clog);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog," color: ",8);
        plVar19 = (long *)std::ostream::operator<<(&std::clog,*(int *)&p_Var18[1]._M_left);
        cVar9 = std::ios::widen((char)*(undefined8 *)(*plVar19 + -0x18) + (char)plVar19);
        pTVar22 = (Tag *)(ulong)(uint)(int)cVar9;
        std::ostream::put((char)plVar19);
        std::ostream::flush();
        AixLog::Function::~Function(&local_2e8);
        if (local_340 != &local_330) {
          pTVar22 = (Tag *)(CONCAT71(local_330._M_allocated_capacity._1_7_,local_330._M_local_buf[0]
                                    ) + 1);
          operator_delete(local_340,(ulong)pTVar22);
        }
        if (local_360 != &local_350) {
          pTVar22 = (Tag *)(CONCAT71(local_350._vptr__Sp_counted_base._1_7_,
                                     local_350._vptr__Sp_counted_base._0_1_) + 1);
          operator_delete(local_360,(ulong)pTVar22);
        }
        local_320 = &PTR__Tag_001edee0;
        if (local_318 != &uStack_308) {
          pTVar22 = (Tag *)(CONCAT71(uStack_307,uStack_308) + 1);
          operator_delete(local_318,(ulong)pTVar22);
        }
        p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
      } while ((_Rb_tree_header *)p_Var18 !=
               &((((local_258.
                    super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->color_map).
                  super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->_M_t)._M_impl.super__Rb_tree_header);
    }
    local_280 = (undefined **)((ulong)local_280 & 0xffffffffffffff00);
    AixLog::operator<<((ostream *)&local_280,(Severity *)pTVar22);
    local_320 = &PTR__Tag_001edee0;
    local_318 = &uStack_308;
    local_310 = 0;
    uStack_308 = 0;
    local_2f8 = 1;
    AixLog::operator<<((ostream *)&local_320,pTVar22);
    local_268 = std::chrono::_V2::system_clock::now();
    local_270 = &PTR__Timestamp_001edeb0;
    local_260 = 0;
    AixLog::operator<<((ostream *)&local_270,(Timestamp *)pTVar22);
    local_360 = &local_350;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"optimize_func","");
    pcVar21 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
    ;
    local_340 = &local_330;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_340,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
               ,"");
    local_2e8._vptr_Function = (_func_int **)&PTR__Function_001edf10;
    local_2e8.name._M_dataplus._M_p = (pointer)&local_2e8.name.field_2;
    if (local_360 == &local_350) {
      local_2e8.name.field_2._8_4_ = local_350._M_use_count;
      local_2e8.name.field_2._12_4_ = local_350._M_weak_count;
    }
    else {
      local_2e8.name._M_dataplus._M_p = (pointer)local_360;
    }
    local_2e8.name.field_2._M_allocated_capacity._1_7_ = local_350._vptr__Sp_counted_base._1_7_;
    local_2e8.name.field_2._M_local_buf[0] = local_350._vptr__Sp_counted_base._0_1_;
    local_2e8.name._M_string_length = local_358;
    local_358 = 0;
    local_350._vptr__Sp_counted_base._0_1_ = 0;
    local_2e8.file._M_dataplus._M_p = (pointer)&local_2e8.file.field_2;
    if (local_340 == &local_330) {
      local_2e8.file.field_2._8_8_ = local_330._8_8_;
    }
    else {
      local_2e8.file._M_dataplus._M_p = (pointer)local_340;
    }
    local_2e8.file.field_2._M_allocated_capacity._1_7_ = local_330._M_allocated_capacity._1_7_;
    local_2e8.file.field_2._M_local_buf[0] = local_330._M_local_buf[0];
    local_2e8.file._M_string_length = local_338;
    local_338 = 0;
    local_330._M_local_buf[0] = '\0';
    local_2e8.line = 0x1b5;
    local_2e8.is_null_ = false;
    local_360 = &local_350;
    local_340 = &local_330;
    AixLog::operator<<((ostream *)&local_2e8,(Function *)pcVar21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"****************************************",0x28);
    std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    AixLog::Function::~Function(&local_2e8);
    if (local_340 != &local_330) {
      operator_delete(local_340,
                      CONCAT71(local_330._M_allocated_capacity._1_7_,local_330._M_local_buf[0]) + 1)
      ;
    }
    if (local_360 != &local_350) {
      operator_delete(local_360,
                      CONCAT71(local_350._vptr__Sp_counted_base._1_7_,
                               local_350._vptr__Sp_counted_base._0_1_) + 1);
    }
    local_320 = &PTR__Tag_001edee0;
    if (local_318 != &uStack_308) {
      operator_delete(local_318,CONCAT71(uStack_307,uStack_308) + 1);
    }
    livevar_analyse::Livevar_Analyse::~Livevar_Analyse((Livevar_Analyse *)local_1d8);
    if (local_258.
        super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_258.
                 super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_1e8.
        super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1e8.
                 super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                 *)local_240);
  }
  return;
}

Assistant:

void optimize_func(std::string funcId, mir::inst::MirFunction& func) {
    if (func.type->is_extern) {
      return;
    }
    LOG(TRACE) << "Running graph coloring for" << func.name << std::endl;
    std::set<mir::inst::VarId> cross_blk_vars;
    auto map = std::make_shared<Color_Map>(std::map<mir::inst::VarId, color>());
    func_color_map.insert({funcId, map});
    func_conflict_map[funcId] = std::make_shared<Conflict_Map>(
        Conflict_Map(func_color_map[funcId], func, color_num));
    auto conflict_map = func_conflict_map[funcId];
    func_unused_colors.insert({funcId, conflict_map->unused_colors});
    livevar_analyse::Livevar_Analyse lva(func, true);
    lva.build();
    for (auto iter = lva.livevars.begin(); iter != lva.livevars.end(); ++iter) {
      init_cross_blk_vars(iter->second, cross_blk_vars);
    }
    LOG(TRACE) << " Conflict map :" << std::endl;

    if (enable) {
      for (auto iter = func.basic_blks.begin(); iter != func.basic_blks.end();
           ++iter) {
        init_conflict_map(lva.livevars[iter->first], conflict_map,
                          cross_blk_vars);
      }
      conflict_map->init_edge_vars();
      for (auto& pair : conflict_map->dynamic_Map) {
        LOG(TRACE) << pair.first << " conflicts with : ";
        for (auto var : pair.second) {
          LOG(TRACE) << var << ", ";
        }
        LOG(TRACE) << std::endl;
      }
      while (!conflict_map->dynamic_Map.empty()) {
        conflict_map->remove_edge_less_colors();
        conflict_map->remove_edge_larger_colors();
      }
      conflict_map->rebuild();
    }

    for (auto& var : cross_blk_vars) {
      if (!conflict_map->color_map->count(var)) {
        conflict_map->color_map->insert(std::make_pair(var, -1));
      }
    }
    LOG(TRACE) << func.name << " coloring result : " << std::endl;
    LOG(TRACE) << "unused colors : ";
    for (auto c : *conflict_map->unused_colors) {
      LOG(TRACE) << c << " ";
    }
    LOG(TRACE) << std::endl;
    for (auto iter = conflict_map->color_map->begin();
         iter != conflict_map->color_map->end(); iter++) {
      LOG(TRACE) << "variable " << iter->first << " color: " << iter->second
                 << std::endl;
    }
    LOG(TRACE) << "****************************************" << std::endl;
  }